

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O0

void __thiscall push_marker_options_t::push_marker_options_t(push_marker_options_t *this)

{
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11;
  push_marker_options_t *local_10;
  push_marker_options_t *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,"http://localhost/test01/test01.isml",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->dry_run_ = false;
  this->announce_ = 0;
  this->seg_dur_ = 2000;
  this->avail_interval_ = 60000;
  this->avail_dur_ = 10000;
  this->track_id_ = 1;
  this->timescale_ = 1000;
  this->send_vtt_ = false;
  this->send_event_ = true;
  this->splice_immediate_ = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->init_string_,"",local_25);
  std::allocator<char>::~allocator(local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->media_string_,"",&local_26);
  std::allocator<char>::~allocator(&local_26);
  return;
}

Assistant:

push_marker_options_t()
        : url_("http://localhost/test01/test01.isml")
        , dry_run_(false)
        , avail_interval_(60000)
        , avail_dur_(10000)
        , seg_dur_(2000)
        , timescale_(1000)
        , track_id_(1)
        , announce_(0)
        , send_vtt_(false)
        , send_event_(true)
        , media_string_("")
        , init_string_("")
        , splice_immediate_(false)
    {
    }